

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DWARFDie.cpp
# Opt level: O0

DWARFDie __thiscall
llvm::DWARFDie::getAttributeValueAsReferencedDie(DWARFDie *this,DWARFFormValue *V)

{
  bool bVar1;
  UnitOffset *pUVar2;
  uint64_t uVar3;
  DWARFUnitVector *this_00;
  DWARFUnit *pDVar4;
  DWARFDie DVar5;
  DWARFUnit *SpecUnit;
  Optional<llvm::DWARFFormValue::UnitOffset> SpecRef;
  DWARFFormValue *V_local;
  DWARFDie *this_local;
  
  SpecRef.Storage._16_8_ = V;
  DWARFFormValue::getAsRelativeReference((Optional<llvm::DWARFFormValue::UnitOffset> *)&SpecUnit,V);
  bVar1 = llvm::Optional::operator_cast_to_bool((Optional *)&SpecUnit);
  if (bVar1) {
    pUVar2 = Optional<llvm::DWARFFormValue::UnitOffset>::operator->
                       ((Optional<llvm::DWARFFormValue::UnitOffset> *)&SpecUnit);
    if (pUVar2->Unit != (DWARFUnit *)0x0) {
      pUVar2 = Optional<llvm::DWARFFormValue::UnitOffset>::operator->
                         ((Optional<llvm::DWARFFormValue::UnitOffset> *)&SpecUnit);
      pDVar4 = pUVar2->Unit;
      pUVar2 = Optional<llvm::DWARFFormValue::UnitOffset>::operator->
                         ((Optional<llvm::DWARFFormValue::UnitOffset> *)&SpecUnit);
      uVar3 = DWARFUnit::getOffset(pUVar2->Unit);
      pUVar2 = Optional<llvm::DWARFFormValue::UnitOffset>::operator->
                         ((Optional<llvm::DWARFFormValue::UnitOffset> *)&SpecUnit);
      DVar5 = DWARFUnit::getDIEForOffset(pDVar4,uVar3 + pUVar2->Offset);
      return DVar5;
    }
    this_00 = DWARFUnit::getUnitVector(this->U);
    pUVar2 = Optional<llvm::DWARFFormValue::UnitOffset>::operator->
                       ((Optional<llvm::DWARFFormValue::UnitOffset> *)&SpecUnit);
    pDVar4 = DWARFUnitVector::getUnitForOffset(this_00,pUVar2->Offset);
    if (pDVar4 != (DWARFUnit *)0x0) {
      pUVar2 = Optional<llvm::DWARFFormValue::UnitOffset>::operator->
                         ((Optional<llvm::DWARFFormValue::UnitOffset> *)&SpecUnit);
      DVar5 = DWARFUnit::getDIEForOffset(pDVar4,pUVar2->Offset);
      return DVar5;
    }
  }
  memset(&this_local,0,0x10);
  DWARFDie((DWARFDie *)&this_local);
  return _this_local;
}

Assistant:

DWARFDie
DWARFDie::getAttributeValueAsReferencedDie(const DWARFFormValue &V) const {
  if (auto SpecRef = V.getAsRelativeReference()) {
    if (SpecRef->Unit)
      return SpecRef->Unit->getDIEForOffset(SpecRef->Unit->getOffset() + SpecRef->Offset);
    if (auto SpecUnit = U->getUnitVector().getUnitForOffset(SpecRef->Offset))
      return SpecUnit->getDIEForOffset(SpecRef->Offset);
  }
  return DWARFDie();
}